

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol.h
# Opt level: O0

void mp::WriteSolFile<mp::SolutionAdapter<StrictMockProblemBuilder>>
               (CStringRef filename,SolutionAdapter<StrictMockProblemBuilder> *sol)

{
  CStringRef arg0;
  int iVar1;
  int iVar2;
  int iVar3;
  SolutionAdapter<StrictMockProblemBuilder> *in_RSI;
  size_t n_1;
  size_t i_3;
  Kind kinds [4];
  int i_2;
  int n;
  int i_1;
  int num_constraints;
  int num_vars;
  int num_dual_values;
  int num_values;
  int i;
  int num_options;
  BufferedFile file;
  undefined8 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  double in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff08;
  BufferedFile *file_00;
  BufferedFile *in_stack_ffffffffffffff18;
  ulong uVar4;
  CStringRef in_stack_ffffffffffffff20;
  ulong uVar5;
  CStringRef in_stack_ffffffffffffff28;
  CStringRef in_stack_ffffffffffffff30;
  BufferedFile *in_stack_ffffffffffffff38;
  BasicCStringRef<char> in_stack_ffffffffffffff48;
  int *in_stack_ffffffffffffff50;
  BasicCStringRef<char> in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int iVar6;
  BufferedFile *in_stack_ffffffffffffff68;
  CStringRef in_stack_ffffffffffffff70;
  int local_84;
  BasicCStringRef<char> local_80;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  long local_68;
  BasicCStringRef<char> local_60;
  int local_54;
  BasicCStringRef<char> local_50;
  int local_44;
  BasicCStringRef<char> local_40;
  BasicSuffixSet<std::allocator<char>_> *in_stack_ffffffffffffffc8;
  BufferedFile *in_stack_ffffffffffffffd0;
  BasicCStringRef<char> local_28 [2];
  BufferedFile local_18;
  SolutionAdapter<StrictMockProblemBuilder> *local_10;
  
  local_10 = in_RSI;
  fmt::BasicCStringRef<char>::BasicCStringRef(local_28,"wb");
  file_00 = &local_18;
  fmt::BufferedFile::BufferedFile
            ((BufferedFile *)in_stack_ffffffffffffff20.data_,in_stack_ffffffffffffff30,
             in_stack_ffffffffffffff28);
  SolutionAdapter<StrictMockProblemBuilder>::message(local_10);
  internal::WriteMessage(file_00,in_stack_ffffffffffffff08);
  fmt::BasicCStringRef<char>::BasicCStringRef(&local_40,"Options\n");
  fmt::BufferedFile::print<>(in_stack_ffffffffffffff18,in_stack_ffffffffffffff20);
  local_44 = SolutionAdapter<StrictMockProblemBuilder>::num_options
                       ((SolutionAdapter<StrictMockProblemBuilder> *)0x22ac13);
  if (local_44 != 0) {
    fmt::BasicCStringRef<char>::BasicCStringRef(&local_50,"{}\n");
    fmt::BufferedFile::print<int>
              (in_stack_ffffffffffffff18,in_stack_ffffffffffffff20,(int *)file_00);
    for (local_54 = 0; local_54 < local_44; local_54 = local_54 + 1) {
      fmt::BasicCStringRef<char>::BasicCStringRef(&local_60,"{}\n");
      local_68 = SolutionAdapter<StrictMockProblemBuilder>::option
                           ((SolutionAdapter<StrictMockProblemBuilder> *)
                            CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                            (int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
      fmt::BufferedFile::print<long>
                (in_stack_ffffffffffffff18,in_stack_ffffffffffffff20,(long *)file_00);
    }
  }
  local_6c = SolutionAdapter<StrictMockProblemBuilder>::num_values
                       ((SolutionAdapter<StrictMockProblemBuilder> *)0x22ad26);
  local_70 = SolutionAdapter<StrictMockProblemBuilder>::num_dual_values
                       ((SolutionAdapter<StrictMockProblemBuilder> *)0x22ad3a);
  iVar1 = SolutionAdapter<StrictMockProblemBuilder>::num_vars
                    ((SolutionAdapter<StrictMockProblemBuilder> *)0x22ad4e);
  local_74 = iVar1;
  iVar2 = SolutionAdapter<StrictMockProblemBuilder>::num_algebraic_cons
                    ((SolutionAdapter<StrictMockProblemBuilder> *)0x22ad6c);
  local_78 = iVar2;
  fmt::BasicCStringRef<char>::BasicCStringRef(&local_80,"{0}\n{1}\n{2}\n{3}\n");
  fmt::BufferedFile::print<int,int,int,int>
            (in_stack_ffffffffffffff68,in_stack_ffffffffffffff70,
             (int *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             (int *)in_stack_ffffffffffffff58.data_,in_stack_ffffffffffffff50,
             (int *)in_stack_ffffffffffffff48.data_);
  iVar6 = local_70;
  for (local_84 = 0; local_84 < iVar6; local_84 = local_84 + 1) {
    fmt::BasicCStringRef<char>::BasicCStringRef
              ((BasicCStringRef<char> *)&stack0xffffffffffffff70,"{:.16}\n");
    SolutionAdapter<StrictMockProblemBuilder>::dual_value
              ((SolutionAdapter<StrictMockProblemBuilder> *)
               CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               (int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
    fmt::BufferedFile::print<double>
              (in_stack_ffffffffffffff18,in_stack_ffffffffffffff20,(double *)file_00);
  }
  for (iVar6 = 0; iVar6 < local_6c; iVar6 = iVar6 + 1) {
    fmt::BasicCStringRef<char>::BasicCStringRef
              ((BasicCStringRef<char> *)&stack0xffffffffffffff58,"{:.16}\n");
    in_stack_fffffffffffffef8 =
         SolutionAdapter<StrictMockProblemBuilder>::value
                   ((SolutionAdapter<StrictMockProblemBuilder> *)
                    CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                    (int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
    fmt::BufferedFile::print<double>
              (in_stack_ffffffffffffff18,in_stack_ffffffffffffff20,(double *)file_00);
  }
  fmt::BasicCStringRef<char>::BasicCStringRef
            ((BasicCStringRef<char> *)&stack0xffffffffffffff48,"objno {} {}\n");
  iVar6 = SolutionAdapter<StrictMockProblemBuilder>::objno(local_10);
  iVar6 = iVar6 + -1;
  iVar3 = SolutionAdapter<StrictMockProblemBuilder>::status(local_10);
  arg0.data_._4_4_ = iVar6;
  arg0.data_._0_4_ = iVar3;
  fmt::BufferedFile::print<int,int>
            (in_stack_ffffffffffffff38,arg0,(int *)in_stack_ffffffffffffff30.data_,
             (int *)in_stack_ffffffffffffff28.data_);
  uVar4 = 4;
  for (uVar5 = 0; uVar5 < uVar4; uVar5 = uVar5 + 1) {
    SolutionAdapter<StrictMockProblemBuilder>::suffixes
              ((SolutionAdapter<StrictMockProblemBuilder> *)CONCAT44(iVar1,iVar2),
               (Kind)((ulong)in_stack_fffffffffffffef8 >> 0x20));
    internal::WriteSuffixes<mp::BasicSuffixSet<std::allocator<char>>>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  fmt::BufferedFile::~BufferedFile((BufferedFile *)CONCAT44(iVar1,iVar2));
  return;
}

Assistant:

void WriteSolFile(fmt::CStringRef filename, const Solution &sol) {
  fmt::BufferedFile file(filename, "wb");
  internal::WriteMessage(file, sol.message());
  // Write options.
  file.print("Options\n");
  if (int num_options = sol.num_options()) {
    file.print("{}\n", num_options);
    for (int i = 0; i < num_options; ++i)
      file.print("{}\n", sol.option(i));
  }
  int num_values = sol.num_values(), num_dual_values = sol.num_dual_values(),
    num_vars = sol.num_vars(), num_constraints = sol.num_algebraic_cons();
  file.print("{0}\n{1}\n{2}\n{3}\n",
    num_constraints, num_dual_values, num_vars, num_values);
  for (int i = 0, n = num_dual_values; i < n; ++i)
    file.print("{:.16}\n", sol.dual_value(i));
  for (int i = 0; i < num_values; ++i)
    file.print("{:.16}\n", sol.value(i));
  file.print("objno {} {}\n", sol.objno()-1, sol.status());
  suf::Kind kinds[] = {suf::VAR, suf::CON, suf::OBJ, suf::PROBLEM};
  for (std::size_t i = 0, n = sizeof(kinds) / sizeof(*kinds); i < n; ++i)
    internal::WriteSuffixes(file, sol.suffixes(kinds[i]));
}